

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
get_next_filled_position
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int pos,bool exclusive)

{
  byte in_DL;
  int in_ESI;
  long in_RDI;
  uint64_t bit;
  int bit_pos;
  uint64_t curBitmapData;
  int curBitmapIdx;
  uint64_t in_stack_ffffffffffffffb8;
  uint64_t local_28;
  int local_1c;
  int local_14;
  int local_4;
  
  local_14 = in_ESI;
  if (((in_DL & 1) == 0) || (local_14 = in_ESI + 1, local_14 != *(int *)(in_RDI + 0x58))) {
    local_1c = local_14 >> 6;
    local_28 = ((1L << ((byte)local_14 & 0x3f)) - 1U ^ 0xffffffffffffffff) &
               *(ulong *)(*(long *)(in_RDI + 0x60) + (long)local_1c * 8);
    while (local_28 == 0) {
      local_1c = local_1c + 1;
      if (*(int *)(in_RDI + 0x68) <= local_1c) {
        return *(int *)(in_RDI + 0x58);
      }
      local_28 = *(uint64_t *)(*(long *)(in_RDI + 0x60) + (long)local_1c * 8);
    }
    extract_rightmost_one(local_28);
    local_4 = get_offset((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffb8);
  }
  else {
    local_4 = *(int *)(in_RDI + 0x58);
  }
  return local_4;
}

Assistant:

int get_next_filled_position(int pos, bool exclusive) const {
    if (exclusive) {
      pos++;
      if (pos == data_capacity_) {
        return data_capacity_;
      }
    }

    int curBitmapIdx = pos >> 6;
    uint64_t curBitmapData = bitmap_[curBitmapIdx];

    // Zero out extra bits
    int bit_pos = pos - (curBitmapIdx << 6);
    curBitmapData &= ~((1ULL << (bit_pos)) - 1);

    while (curBitmapData == 0) {
      curBitmapIdx++;
      if (curBitmapIdx >= bitmap_size_) {
        return data_capacity_;
      }
      curBitmapData = bitmap_[curBitmapIdx];
    }
    uint64_t bit = extract_rightmost_one(curBitmapData);
    return get_offset(curBitmapIdx, bit);
  }